

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O2

TRef lj_ir_kptr_(jit_State *J,IROp op,void *ptr)

{
  ushort uVar1;
  IRIns *pIVar2;
  IRRef1 *pIVar3;
  uint uVar4;
  IRRef1 *pIVar6;
  ulong uVar5;
  
  pIVar2 = (J->cur).ir;
  pIVar6 = J->chain + op;
  pIVar3 = pIVar6;
  do {
    uVar1 = *pIVar3;
    uVar4 = (uint)uVar1;
    if ((ulong)uVar1 == 0) {
      uVar4 = (J->cur).nk;
      if (uVar4 <= J->irbotlim) {
        lj_ir_growbot(J);
        pIVar2 = (J->cur).ir;
      }
      uVar4 = uVar4 - 1;
      uVar5 = (ulong)uVar4;
      (J->cur).nk = uVar4;
      pIVar2[uVar5].field_1.op12 = (IRRef2)ptr;
      *(undefined1 *)((long)pIVar2 + uVar5 * 8 + 4) = 5;
      *(char *)((long)pIVar2 + uVar5 * 8 + 5) = (char)op;
      *(IRRef1 *)((long)pIVar2 + uVar5 * 8 + 6) = *pIVar6;
      *pIVar6 = (ushort)uVar4;
      break;
    }
    pIVar3 = &pIVar2[uVar1].field_0.prev;
  } while ((void *)(ulong)pIVar2[uVar1].field_1.op12 != ptr);
  return uVar4 + 0x5000000;
}

Assistant:

TRef lj_ir_kptr_(jit_State *J, IROp op, void *ptr)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
#if LJ_64 && !LJ_GC64
  lj_assertJ((void *)(uintptr_t)u32ptr(ptr) == ptr, "out-of-range GC pointer");
#endif
  for (ref = J->chain[op]; ref; ref = cir[ref].prev)
    if (ir_kptr(&cir[ref]) == ptr)
      goto found;
#if LJ_GC64
  ref = ir_nextk64(J);
#else
  ref = ir_nextk(J);
#endif
  ir = IR(ref);
  ir->op12 = 0;
  setmref(ir[LJ_GC64].ptr, ptr);
  ir->t.irt = IRT_PGC;
  ir->o = op;
  ir->prev = J->chain[op];
  J->chain[op] = (IRRef1)ref;
found:
  return TREF(ref, IRT_PGC);
}